

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void DoOneIntegrationTest
               (List<MiniScript::String> *sourceLines,long sourceLineNum,
               List<MiniScript::String> *expectedOutput,long outputLineNum)

{
  ulong uVar1;
  bool bVar2;
  String *pSVar3;
  String *s;
  long lVar4;
  unsigned_long uVar5;
  unsigned_long idx;
  String local_118;
  String local_108;
  Interpreter miniscript;
  String local_b0;
  List<MiniScript::String> local_a0;
  String local_90;
  String local_80;
  String local_70;
  String local_60;
  String local_50;
  String local_40;
  
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  MiniScript::List<MiniScript::String>::List(&local_a0,sourceLines);
  MiniScript::Interpreter::Interpreter(&miniscript,&local_a0);
  MiniScript::List<MiniScript::String>::release(&local_a0);
  miniscript.standardOutput = PrintToTestOutput;
  miniscript.errorOutput = PrintToTestOutput;
  miniscript.implicitOutput = PrintToTestOutput;
  MiniScript::Interpreter::RunUntilDone(&miniscript,60.0,false);
  MiniScript::Interpreter::~Interpreter(&miniscript);
  lVar4 = *(long *)sourceLineNum;
  if (lVar4 == 0) {
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar1 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
      uVar5 = (long)uVar1 >> 0x3f & uVar1;
    }
  }
  else {
    uVar1 = *(ulong *)(lVar4 + 0x20);
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar5 = (long)uVar1 >> 0x3f & uVar1;
    }
    else {
      uVar5 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
      if ((long)uVar1 < (long)uVar5) {
        uVar5 = *(unsigned_long *)(lVar4 + 0x20);
      }
    }
  }
  idx = 0;
  if ((long)uVar5 < 1) {
    uVar5 = idx;
  }
  for (; uVar5 != idx; idx = idx + 1) {
    pSVar3 = MiniScript::List<MiniScript::String>::operator[](&testOutput,idx);
    s = MiniScript::List<MiniScript::String>::operator[]
                  ((List<MiniScript::String> *)sourceLineNum,idx);
    bVar2 = MiniScript::String::operator!=(pSVar3,s);
    if (bVar2) {
      MiniScript::String::Format(&local_b0,(long)&expectedOutput->ls + idx,"%ld");
      MiniScript::operator+((MiniScript *)&local_70,"TEST FAILED AT LINE ",&local_b0);
      MiniScript::String::operator+(&local_60,(char *)&local_70);
      MiniScript::List<MiniScript::String>::operator[]
                ((List<MiniScript::String> *)sourceLineNum,idx);
      MiniScript::String::operator+(&local_50,&local_60);
      MiniScript::String::operator+((String *)&miniscript,(char *)&local_50);
      MiniScript::List<MiniScript::String>::operator[](&testOutput,idx);
      MiniScript::String::operator+(&local_40,(String *)&miniscript);
      Print(&local_40,true);
      MiniScript::String::~String(&local_40);
      MiniScript::String::~String((String *)&miniscript);
      MiniScript::String::~String(&local_50);
      MiniScript::String::~String(&local_60);
      MiniScript::String::~String(&local_70);
      MiniScript::String::~String(&local_b0);
    }
  }
  lVar4 = *(long *)sourceLineNum;
  if (lVar4 == 0) {
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) goto LAB_00106d2b;
    uVar5 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
    if ((long)uVar5 < 0) goto LAB_00106b94;
    if (uVar5 == 0) goto LAB_00106d2b;
    lVar4 = 0;
  }
  else {
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar5 = 0;
      if (0 < *(long *)(lVar4 + 0x20)) goto LAB_00106b94;
    }
    else {
      uVar5 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
      if ((long)uVar5 < *(long *)(lVar4 + 0x20)) {
LAB_00106b94:
        MiniScript::String::Format((String *)&miniscript,(long)&expectedOutput->ls + uVar5,"%ld");
        MiniScript::operator+
                  ((MiniScript *)&local_108,"TEST FAILED: MISSING OUTPUT AT LINE ",
                   (String *)&miniscript);
        Print(&local_108,true);
        MiniScript::String::~String(&local_108);
        MiniScript::String::~String((String *)&miniscript);
        if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
        }
        while( true ) {
          if (*(long *)sourceLineNum == 0) {
            lVar4 = 0;
          }
          else {
            lVar4 = *(long *)(*(long *)sourceLineNum + 0x20);
          }
          if (lVar4 <= (long)uVar5) break;
          pSVar3 = MiniScript::List<MiniScript::String>::operator[]
                             ((List<MiniScript::String> *)sourceLineNum,uVar5);
          MiniScript::operator+((MiniScript *)&local_80,"  MISSING: ",pSVar3);
          Print(&local_80,true);
          MiniScript::String::~String(&local_80);
          uVar5 = uVar5 + 1;
        }
        goto LAB_00106d2b;
      }
    }
    lVar4 = *(long *)(lVar4 + 0x20);
    if ((long)uVar5 <= lVar4) goto LAB_00106d2b;
  }
  MiniScript::String::Format((String *)&miniscript,(long)&expectedOutput->ls + lVar4,"%ld");
  MiniScript::operator+
            ((MiniScript *)&local_118,"TEST FAILED: EXTRA OUTPUT AT LINE ",(String *)&miniscript);
  Print(&local_118,true);
  MiniScript::String::~String(&local_118);
  MiniScript::String::~String((String *)&miniscript);
  if (*(long *)sourceLineNum == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *(long *)(*(long *)sourceLineNum + 0x20);
  }
  while( true ) {
    if (testOutput.ls == (ListStorage<MiniScript::String> *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = ((testOutput.ls)->super_SimpleVector<MiniScript::String>).mQtyItems;
    }
    if ((long)uVar5 <= lVar4) break;
    pSVar3 = MiniScript::List<MiniScript::String>::operator[](&testOutput,lVar4);
    MiniScript::operator+((MiniScript *)&local_90,"  EXTRA: ",pSVar3);
    Print(&local_90,true);
    MiniScript::String::~String(&local_90);
    lVar4 = lVar4 + 1;
  }
LAB_00106d2b:
  MiniScript::List<MiniScript::String>::Clear(&testOutput);
  return;
}

Assistant:

static void DoOneIntegrationTest(List<String> sourceLines, long sourceLineNum,
				 List<String> expectedOutput, long outputLineNum) {
//	std::cout << "Running test starting at line " << sourceLineNum << std::endl;
	
	testOutput.Clear();
	{
		Interpreter miniscript(sourceLines);
		miniscript.standardOutput = &PrintToTestOutput;
		miniscript.errorOutput = &PrintToTestOutput;
		miniscript.implicitOutput = &PrintToTestOutput;
		miniscript.RunUntilDone(60, false);
	}
	
	long minLen = expectedOutput.Count() < testOutput.Count() ? expectedOutput.Count() : testOutput.Count();
	for (long i = 0; i < minLen; i++) {
		if (testOutput[i] != expectedOutput[i]) {
			Print("TEST FAILED AT LINE " + String::Format(outputLineNum + i)
			+ "\n  EXPECTED: " + expectedOutput[i]
			+ "\n    ACTUAL: " + testOutput[i]);
		}
	}
	if (expectedOutput.Count() > testOutput.Count()) {
		Print("TEST FAILED: MISSING OUTPUT AT LINE " + String::Format(outputLineNum + testOutput.Count()));
		for (long i = testOutput.Count(); i < expectedOutput.Count(); i++) {
			Print("  MISSING: " + expectedOutput[i]);
		}
	} else if (testOutput.Count() > expectedOutput.Count()) {
		Print("TEST FAILED: EXTRA OUTPUT AT LINE " + String::Format(outputLineNum + expectedOutput.Count()));
		for (long i = expectedOutput.Count(); i < testOutput.Count(); i++) {
			Print("  EXTRA: " + testOutput[i]);
		}
	}
	testOutput.Clear();
}